

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::api::json::PsbtSignatureData::~PsbtSignatureData(PsbtSignatureData *this)

{
  PsbtSignatureData *in_RDI;
  
  ~PsbtSignatureData(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~PsbtSignatureData() {
    // do nothing
  }